

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::LogDisabledTests
          (cmCTestTestHandler *this,
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          *disabledTests)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pcVar5;
  char *pcVar6;
  string local_430;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  
  if ((disabledTests->
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (disabledTests->
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
    poVar4 = std::operator<<(poVar4,"The following tests did not run:");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x298,local_430._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"TestsDisabled",&ofs);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTest::GetColorCode_abi_cxx11_(&local_430,(this->super_cmCTestGenericHandler).CTest,BLUE);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x29d,local_430._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pcVar2 = (disabledTests->
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pcVar5 = (disabledTests->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  )._M_impl.super__Vector_impl_data._M_start; pcVar5 != pcVar2; pcVar5 = pcVar5 + 1)
    {
      poVar4 = (ostream *)std::ostream::operator<<(&ofs,pcVar5->TestCount);
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = std::operator<<(poVar4,(string *)pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar3 = std::operator==(&pcVar5->CompletionStatus,"Disabled");
      pcVar6 = "Skipped";
      if (bVar3) {
        pcVar6 = "Disabled";
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"\t");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 3;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pcVar5->TestCount);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4,(string *)pcVar5);
      poVar4 = std::operator<<(poVar4," (");
      poVar4 = std::operator<<(poVar4,pcVar6);
      poVar4 = std::operator<<(poVar4,")");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x2a7,local_430._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTest::GetColorCode_abi_cxx11_
              (&local_430,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x2aa,local_430._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  }
  return;
}

Assistant:

void cmCTestTestHandler::LogDisabledTests(
  const std::vector<cmCTestTestResult>& disabledTests)
{
  if (!disabledTests.empty()) {
    cmGeneratedFileStream ofs;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::endl
                 << "The following tests did not run:" << std::endl);
    this->StartLogFile("TestsDisabled", ofs);

    const char* disabled_reason;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::BLUE));
    for (cmCTestTestResult const& dt : disabledTests) {
      ofs << dt.TestCount << ":" << dt.Name << std::endl;
      if (dt.CompletionStatus == "Disabled") {
        disabled_reason = "Disabled";
      } else {
        disabled_reason = "Skipped";
      }
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "\t" << std::setw(3) << dt.TestCount << " - " << dt.Name
                      << " (" << disabled_reason << ")" << std::endl);
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR));
  }
}